

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

FBehavior * FBehavior::StaticLoadModule(int lumpnum,FileReader *fr,int len)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  FBehavior *unaff_R14;
  bool bVar4;
  
  if (lumpnum == -1 && fr == (FileReader *)0x0) {
    unaff_R14 = (FBehavior *)0x0;
  }
  else {
    bVar4 = StaticModules.Count != 0;
    if (bVar4) {
      unaff_R14 = *StaticModules.Array;
      if (unaff_R14->LumpNum != lumpnum) {
        lVar3 = 1;
        do {
          uVar2 = (uint)lVar3;
          if (StaticModules.Count == uVar2) break;
          unaff_R14 = StaticModules.Array[lVar3];
          lVar3 = lVar3 + 1;
        } while (unaff_R14->LumpNum != lumpnum);
        bVar4 = uVar2 < StaticModules.Count;
      }
    }
    if (!bVar4) {
      unaff_R14 = (FBehavior *)operator_new(0x698);
      (unaff_R14->Imports).Array = (FBehavior **)0x0;
      (unaff_R14->Imports).Most = 0;
      (unaff_R14->Imports).Count = 0;
      (unaff_R14->JumpPoints).Array = (int *)0x0;
      (unaff_R14->JumpPoints).Most = 0;
      (unaff_R14->JumpPoints).Count = 0;
      unaff_R14->NumFunctions = 0;
      unaff_R14->NumArrays = 0;
      unaff_R14->NumTotalArrays = 0;
      unaff_R14->Functions = (ScriptFunction *)0x0;
      unaff_R14->Arrays = (ArrayInfo **)0x0;
      unaff_R14->ArrayStore = (ArrayInfo *)0x0;
      unaff_R14->Data = (BYTE *)0x0;
      unaff_R14->Chunks = (BYTE *)0x0;
      unaff_R14->Scripts = (ScriptPtr *)0x0;
      unaff_R14->NumScripts = 0;
      unaff_R14->Format = ACS_Unknown;
      unaff_R14->LumpNum = -1;
      memset(unaff_R14->MapVarStore,0,0x200);
      unaff_R14->ModuleName[0] = '\0';
      unaff_R14->FunctionProfileData = (ACSProfileInfo *)0x0;
      bVar4 = Init(unaff_R14,lumpnum,fr,len);
      if (!bVar4) {
        ~FBehavior(unaff_R14);
        operator_delete(unaff_R14,0x698);
        pcVar1 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
        unaff_R14 = (FBehavior *)0x0;
        Printf("\x1cG%s: invalid ACS module\n",pcVar1);
      }
    }
  }
  return unaff_R14;
}

Assistant:

FBehavior *FBehavior::StaticLoadModule (int lumpnum, FileReader *fr, int len)
{
	if (lumpnum == -1 && fr == NULL) return NULL;

	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (StaticModules[i]->LumpNum == lumpnum)
		{
			return StaticModules[i];
		}
	}

	FBehavior * behavior = new FBehavior ();
	if (behavior->Init(lumpnum, fr, len))
	{
		return behavior;
	}
	else
	{
		delete behavior;
		Printf(TEXTCOLOR_RED "%s: invalid ACS module\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
}